

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdmiCecSimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
HdmiCecSimulationDataGenerator::Initialize
          (HdmiCecSimulationDataGenerator *this,U32 simulation_sample_rate,
          HdmiCecAnalyzerSettings *settings)

{
  int iVar1;
  HdmiCecAnalyzerSettings *settings_local;
  U32 simulation_sample_rate_local;
  HdmiCecSimulationDataGenerator *this_local;
  
  this->mSimulationSampleRateHz = simulation_sample_rate;
  this->mSettings = settings;
  this->mSimulateErrors = false;
  this->mErrorType = ERR_NOERROR;
  iVar1 = (int)this;
  ClockGenerator::Init(100000.0,iVar1 + 0x18);
  srand(0x2a);
  SimulationChannelDescriptor::SetChannel((Channel *)&this->mCecSimulationData);
  SimulationChannelDescriptor::SetSampleRate(iVar1 + 0x10);
  SimulationChannelDescriptor::SetInitialBitState(iVar1 + 0x10);
  AdvanceRand(this,0.5,2.0);
  return;
}

Assistant:

void HdmiCecSimulationDataGenerator::Initialize( U32 simulation_sample_rate, HdmiCecAnalyzerSettings* settings )
{
    mSimulationSampleRateHz = simulation_sample_rate;
    mSettings = settings;
    mSimulateErrors = false; // NOTICE change this to introduce simulation errors
    mErrorType = ERR_NOERROR;

    // Initialize clock at the recomended sampling rate
    mClockGenerator.Init( HdmiCec::MinSampleRateHz, mSimulationSampleRateHz );

    // Initialize the random number generator with a literal seed to obtain repeatability
    // Change this for srand(time(NULL)) for "truly" random sequences
    // NOTICE rand() an srand() are *not* thread safe
    srand( 42 );

    mCecSimulationData.SetChannel( mSettings->mCecChannel );
    mCecSimulationData.SetSampleRate( simulation_sample_rate );
    mCecSimulationData.SetInitialBitState( BIT_HIGH );
    // Advance a few ms in HIGH
    AdvanceRand( 0.5f, 2.0f );
}